

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O2

void __thiscall EventLoop::add_task(EventLoop *this,Task *cb)

{
  bool bVar1;
  Logger *pLVar2;
  
  pLVar2 = Logger::get_instance();
  if ((pLVar2->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","add_task",0x2c);
  }
  if (1 < (int)g_log_level) {
    pLVar2 = Logger::get_instance();
    Logger::write_log(pLVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp"
                      ,"add_task",0x2c,LOG_LEVEL_INFO,"eventloop, add one task\n");
    pLVar2 = Logger::get_instance();
    Logger::flush(pLVar2);
  }
  bVar1 = is_in_loop_thread(this);
  if (bVar1) {
    std::function<void_()>::operator()(cb);
  }
  else {
    std::mutex::lock(&this->el_mutex);
    std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>>
              ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
               &this->el_task_funcs,cb);
    pthread_mutex_unlock((pthread_mutex_t *)&this->el_mutex);
  }
  bVar1 = is_in_loop_thread(this);
  if ((bVar1) && (this->el_dealing_task_funcs != true)) {
    return;
  }
  evfd_wakeup(this);
  return;
}

Assistant:

void EventLoop::add_task(Task&& cb) {
LOG_INFO("eventloop, add one task\n");
    if (is_in_loop_thread())
    {
        cb();
    }
    else
    {
        lock_guard<mutex> lock(el_mutex);
        el_task_funcs.emplace_back(move(cb));       
    }

    if (!is_in_loop_thread() || el_dealing_task_funcs) { evfd_wakeup(); }
}